

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PrimitiveInstantiationSyntax::PrimitiveInstantiationSyntax
          (PrimitiveInstantiationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token type,
          NetStrengthSyntax *strength,TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances,Token semi)

{
  bool bVar1;
  HierarchicalInstanceSyntax *pHVar2;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  HierarchicalInstanceSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *in_stack_ffffffffffffff88;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *this_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_58;
  undefined1 in_stack_ffffffffffffffb8 [16];
  
  this_00 = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)&stack0x00000010;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._4_4_,local_58);
  in_RDI[3].parent = in_RDX;
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  in_RDI[4].parent = in_R9;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::SeparatedSyntaxList
            (this_00,in_stack_ffffffffffffff88);
  *(_func_int ***)(in_RDI + 7) = (this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[7].parent = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  if (*(long *)(in_RDI + 4) != 0) {
    *(SyntaxNode **)(*(long *)(in_RDI + 4) + 8) = in_RDI;
  }
  if (in_RDI[4].parent != (SyntaxNode *)0x0) {
    (in_RDI[4].parent)->parent = in_RDI;
  }
  in_RDI[5].parent = in_RDI;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x80bf85);
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::end(this_00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::HierarchicalInstanceSyntax_*> *)
                       in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pHVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                          *)0x80bfc4);
    (pHVar2->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

PrimitiveInstantiationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token type, NetStrengthSyntax* strength, TimingControlSyntax* delay, const SeparatedSyntaxList<HierarchicalInstanceSyntax>& instances, Token semi) :
        MemberSyntax(SyntaxKind::PrimitiveInstantiation, attributes), type(type), strength(strength), delay(delay), instances(instances), semi(semi) {
        if (this->strength) this->strength->parent = this;
        if (this->delay) this->delay->parent = this;
        this->instances.parent = this;
        for (auto child : this->instances)
            child->parent = this;
    }